

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Configuration CVar1;
  clock_t cVar2;
  clock_t cVar3;
  ostream *poVar4;
  int iVar5;
  PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
  reader;
  int argc_offset;
  SquareSolverService service;
  PolynomeReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_3U>
  local_e0;
  int local_c4;
  SquareSolverService local_c0;
  
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 100;
  CVar1 = ParseCmdArgs(argc,argv,&local_c4);
  cVar2 = clock();
  if (((uint)CVar1 >> 0x18 & 1) == 0) {
    local_e0._vptr_PolynomeReader = (_func_int **)&PTR__PolynomeReader_0011aca0;
    local_e0.kPolynomeDegree = 3;
    local_e0.finished = false;
    local_e0.reader._M_t.
    super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    .
    super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_true,_true>
          )operator_new(0x20);
    *(undefined1 *)
     ((long)local_e0.reader._M_t.
            super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
            .
            super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
            ._M_head_impl + 8) = 0;
    *(undefined ***)
     local_e0.reader._M_t.
     super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
     .
     super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
     ._M_head_impl = &PTR__BasicValueReader_0011ad48;
    *(undefined4 *)
     ((long)local_e0.reader._M_t.
            super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
            .
            super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
            ._M_head_impl + 0xc) = 0;
    *(int *)((long)local_e0.reader._M_t.
                   super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                   .
                   super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
                   ._M_head_impl + 0x10) = argc - local_c4;
    *(char ***)
     ((long)local_e0.reader._M_t.
            super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
            .
            super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
            ._M_head_impl + 0x18) = argv + local_c4;
    iVar5 = 0x20;
  }
  else {
    local_e0._vptr_PolynomeReader = (_func_int **)&PTR__PolynomeReader_0011aca0;
    local_e0.kPolynomeDegree = 3;
    local_e0.finished = false;
    local_e0.reader._M_t.
    super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    .
    super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_true,_true>
          )operator_new(0x18);
    *(undefined1 *)
     ((long)local_e0.reader._M_t.
            super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
            .
            super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
            ._M_head_impl + 8) = 0;
    *(undefined ***)
     local_e0.reader._M_t.
     super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
     ._M_t.
     super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
     .
     super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
     ._M_head_impl = &PTR__BasicValueReader_0011acd0;
    *(undefined8 **)
     ((long)local_e0.reader._M_t.
            super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
            .
            super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
            ._M_head_impl + 0x10) = &std::cin;
    iVar5 = 1;
  }
  local_c0._vptr_SquareSolverService = (_func_int **)&PTR__SquareSolverService_0011aa98;
  local_c0.reader = &local_e0;
  BuildSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ();
  local_c0.kSilent = (bool)(CVar1.silent & 1);
  local_c0.mtx.super___mutex_base._M_mutex.__align = 0;
  local_c0.mtx.super___mutex_base._M_mutex._8_8_ = 0;
  local_c0.mtx.super___mutex_base._M_mutex._16_8_ = 0;
  local_c0.mtx.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_c0.mtx.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_c0.kBatchSize = iVar5;
  std::condition_variable::condition_variable(&local_c0.cvar);
  local_c0.batchReady._M_base._M_i = (__atomic_base<bool>)false;
  local_c0.preparedBatch._M_t.
  super___uniq_ptr_impl<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::default_delete<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_*,_std::default_delete<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::default_delete<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::default_delete<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
          )0x0;
  local_c0.formingBatch._M_t.
  super___uniq_ptr_impl<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::default_delete<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_*,_std::default_delete<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::default_delete<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::default_delete<std::vector<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<Polynome<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
          )0x0;
  SquareSolverService::Run(&local_c0);
  cVar3 = clock();
  if (((uint)CVar1 >> 0x10 & 1) != 0) {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 6;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"request processing time: ",0x19);
    poVar4 = std::ostream::_M_insert<double>((double)(cVar3 - cVar2) / 1000000.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  SquareSolverService::~SquareSolverService(&local_c0);
  local_e0._vptr_PolynomeReader = (_func_int **)&PTR__PolynomeReader_0011aca0;
  if ((_Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
       )local_e0.reader._M_t.
        super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        .
        super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
        ._M_head_impl !=
      (BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
       *)0x0) {
    (**(code **)(*(long *)local_e0.reader._M_t.
                          super___uniq_ptr_impl<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                          .
                          super__Head_base<0UL,_BasicValueReader<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    std::cout.precision(std::numeric_limits<FloatType>::digits10);
    
    //argc_offset is used to make clear from which point of arguments interesting data is placed
    int argc_offset;
    const Configuration config = ParseCmdArgs(argc, argv, argc_offset);
    
    clock_t requestStartTime = clock();
    
    //interactive mode allows to type coeffs in console in real time
    PolynomeReader<FloatType, 3> reader = config.interactive ? PolynomeReader<FloatType, 3>(std::cin) : PolynomeReader<FloatType, 3>(argc - argc_offset, argv + argc_offset);
    SquareSolverService service(reader, config.silent, config.interactive ? 1 : 32);
    service.Run();
    
    clock_t requestEndTime = clock();

    if (config.measurePerformance) {
        std::cout.precision(6);
        std::cout << "request processing time: " << (requestEndTime - requestStartTime) / double(CLOCKS_PER_SEC) << std::endl;
    }
        
    return 0;
}